

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

uint32_t __thiscall spvtools::opt::Pass::TakeNextId(Pass *this)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  string message;
  size_type __dnew;
  size_t *local_68;
  size_t local_60;
  size_t local_58 [2];
  spv_position_t local_48;
  
  pIVar1 = this->context_;
  uVar2 = Module::TakeNextIdBound
                    ((pIVar1->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((uVar2 == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_48.line = 0x25;
    local_68 = local_58;
    local_68 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
    local_58[0] = local_48.line;
    *local_68 = 0x667265766f204449;
    local_68[1] = 0x797254202e776f6c;
    local_68[2] = 0x676e696e6e757220;
    local_68[3] = 0x746361706d6f6320;
    builtin_strncpy((char *)((long)local_68 + 0x1d),"act-ids.",8);
    local_60 = local_48.line;
    *(char *)((long)local_68 + local_48.line) = '\0';
    local_48.line = 0;
    local_48.column = 0;
    local_48.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_48,(char *)local_68);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
  }
  return uVar2;
}

Assistant:

uint32_t TakeNextId() { return context_->TakeNextId(); }